

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::BinaryOpExpr::do_evaluate
          (Value *__return_storage_ptr__,BinaryOpExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  runtime_error *this_01;
  anon_class_16_2_06e2585c_for_do_eval do_eval;
  CallableType local_f0;
  Value l;
  anon_class_96_2_f55c4da0 local_80;
  
  this_00 = (this->left).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"BinaryOpExpr.left is null");
  }
  else {
    if ((this->right).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Expression::evaluate(&l,this_00,context);
      do_eval.this = this;
      do_eval.context = context;
      if (l.callable_.
          super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        do_evaluate::anon_class_96_2_f55c4da0::anon_class_16_2_06e2585c_for_do_eval::operator()
                  (__return_storage_ptr__,&do_eval,&l);
      }
      else {
        Value::Value(&local_80.l,&l);
        local_80.do_eval.this = do_eval.this;
        local_80.do_eval.context = do_eval.context;
        std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
        function<minja::BinaryOpExpr::do_evaluate(std::shared_ptr<minja::Context>const&)const::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_1_,void>
                  ((function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>
                    *)&local_f0,&local_80);
        Value::callable(__return_storage_ptr__,&local_f0);
        std::_Function_base::~_Function_base(&local_f0.super__Function_base);
        Value::~Value(&local_80.l);
      }
      Value::~Value(&l);
      return __return_storage_ptr__;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"BinaryOpExpr.right is null");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!left) throw std::runtime_error("BinaryOpExpr.left is null");
        if (!right) throw std::runtime_error("BinaryOpExpr.right is null");
        auto l = left->evaluate(context);

        auto do_eval = [&](const Value & l) -> Value {
          if (op == Op::Is || op == Op::IsNot) {
            auto t = dynamic_cast<VariableExpr*>(right.get());
            if (!t) throw std::runtime_error("Right side of 'is' operator must be a variable");

            auto eval = [&]() {
              const auto & name = t->get_name();
              if (name == "none") return l.is_null();
              if (name == "boolean") return l.is_boolean();
              if (name == "integer") return l.is_number_integer();
              if (name == "float") return l.is_number_float();
              if (name == "number") return l.is_number();
              if (name == "string") return l.is_string();
              if (name == "mapping") return l.is_object();
              if (name == "iterable") return l.is_iterable();
              if (name == "sequence") return l.is_array();
              if (name == "defined") return !l.is_null();
              throw std::runtime_error("Unknown type for 'is' operator: " + name);
            };
            auto value = eval();
            return Value(op == Op::Is ? value : !value);
          }

          if (op == Op::And) {
            if (!l.to_bool()) return Value(false);
            return right->evaluate(context).to_bool();
          } else if (op == Op::Or) {
            if (l.to_bool()) return l;
            return right->evaluate(context);
          }

          auto r = right->evaluate(context);
          switch (op) {
              case Op::StrConcat: return l.to_str() + r.to_str();
              case Op::Add:       return l + r;
              case Op::Sub:       return l - r;
              case Op::Mul:       return l * r;
              case Op::Div:       return l / r;
              case Op::MulMul:    return std::pow(l.get<double>(), r.get<double>());
              case Op::DivDiv:    return l.get<int64_t>() / r.get<int64_t>();
              case Op::Mod:       return l.get<int64_t>() % r.get<int64_t>();
              case Op::Eq:        return l == r;
              case Op::Ne:        return l != r;
              case Op::Lt:        return l < r;
              case Op::Gt:        return l > r;
              case Op::Le:        return l <= r;
              case Op::Ge:        return l >= r;
              case Op::In:        return (r.is_array() || r.is_object()) && r.contains(l);
              case Op::NotIn:     return !(r.is_array() && r.contains(l));
              default:            break;
          }
          throw std::runtime_error("Unknown binary operator");
        };

        if (l.is_callable()) {
          return Value::callable([l, do_eval](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
            auto ll = l.call(context, args);
            return do_eval(ll); //args[0].second);
          });
        } else {
          return do_eval(l);
        }
    }